

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O3

void __thiscall
chrono::ChVisualShapeFEA::UpdateBuffers_Hex
          (ChVisualShapeFEA *this,shared_ptr<chrono::fea::ChElementBase> *element,
          ChTriangleMeshConnected *trianglemesh,uint *i_verts,uint *i_vnorms,uint *i_vcols,
          uint *i_triindex)

{
  pointer pCVar1;
  double *pdVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pCVar5;
  long lVar6;
  pointer pCVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ChVisualShapeFEA *pCVar12;
  int iVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar14;
  long *plVar15;
  undefined8 *puVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ChVector<double> pt [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> nodes [8];
  undefined1 local_1d8 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_1a8;
  double local_198;
  uint *local_190;
  double local_188;
  uint *local_180;
  undefined1 local_178 [16];
  undefined8 auStack_168 [6];
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  long local_b8 [17];
  
  local_188 = (double)(ulong)*i_verts;
  plVar15 = local_b8;
  puVar16 = (undefined8 *)(local_178 + 0x10);
  uVar23 = 0;
  local_198 = (double)(ulong)*i_vnorms;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_f8 = ZEXT1664(ZEXT816(0));
  local_138 = ZEXT1664(ZEXT816(0));
  _local_178 = ZEXT1664(ZEXT816(0));
  local_190 = i_vnorms;
  local_180 = i_verts;
  do {
    peVar3 = (element->super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*peVar3->_vptr_ChElementBase[5])(local_1d8,peVar3,uVar23 & 0xffffffff);
    lVar11 = CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
    if (lVar11 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar11 + 8) = *(int *)(lVar11 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar11 + 8) = *(int *)(lVar11 + 8) + 1;
      }
    }
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar15[1];
    *plVar15 = local_1d8._0_8_;
    plVar15[1] = CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_)
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_1d8._12_4_,local_1d8._8_4_));
    }
    if (this->undeformed_reference == false) {
      lVar11 = *plVar15;
      uVar14 = *(undefined8 *)(lVar11 + 0x28);
      puVar16[-2] = *(undefined8 *)(lVar11 + 0x20);
      puVar16[-1] = uVar14;
      uVar14 = *(undefined8 *)(lVar11 + 0x30);
    }
    else {
      (**(code **)(*(long *)*plVar15 + 0x60))(local_1d8);
      puVar16[-2] = local_1d8._0_8_;
      puVar16[-1] = CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
      uVar14 = local_1d8._16_8_;
    }
    *puVar16 = uVar14;
    uVar23 = uVar23 + 1;
    puVar16 = puVar16 + 3;
    plVar15 = plVar15 + 2;
  } while (uVar23 != 8);
  if (this->shrink_elements == true) {
    dVar31 = 0.0;
    lVar11 = 8;
    auVar33 = ZEXT816(0) << 0x40;
    do {
      dVar31 = dVar31 + *(double *)(local_178 + lVar11 + -8);
      auVar34._0_8_ = auVar33._0_8_ + *(double *)(local_178 + lVar11);
      auVar34._8_8_ = auVar33._8_8_ + *(double *)(local_178 + lVar11 + 8);
      lVar11 = lVar11 + 0x18;
      auVar33 = auVar34;
    } while (lVar11 != 200);
    auVar32 = vshufpd_avx(auVar34,auVar34,1);
    auVar24 = vpermi2pd_avx512f(_DAT_009dda00,_local_178,local_138);
    auVar25 = vpermi2pd_avx512f(_DAT_009dda80,_local_178,local_138);
    auVar26 = vpermi2pd_avx512f(_DAT_009ddb00,local_138,_local_178);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = this->shrink_factor;
    auVar27 = vbroadcastsd_avx512f(auVar33);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = auVar32._0_8_ * 0.125;
    auVar28 = vbroadcastsd_avx512f(auVar36);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = auVar34._0_8_ * 0.125;
    auVar29 = vbroadcastsd_avx512f(auVar35);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar31 * 0.125;
    auVar30 = vbroadcastsd_avx512f(auVar32);
    auVar24 = vpermi2pd_avx512f(_DAT_009dda40,auVar24,local_f8);
    auVar25 = vpermi2pd_avx512f(_DAT_009ddac0,auVar25,local_f8);
    auVar26 = vpermi2pd_avx512f(_DAT_009ddb40,auVar26,local_f8);
    auVar25 = vsubpd_avx512f(auVar25,auVar29);
    auVar26 = vsubpd_avx512f(auVar26,auVar28);
    auVar24 = vsubpd_avx512f(auVar24,auVar30);
    auVar26 = vmulpd_avx512f(auVar26,auVar27);
    auVar26 = vaddpd_avx512f(auVar28,auVar26);
    auVar25 = vmulpd_avx512f(auVar27,auVar25);
    auVar24 = vmulpd_avx512f(auVar27,auVar24);
    auVar25 = vaddpd_avx512f(auVar29,auVar25);
    auVar24 = vaddpd_avx512f(auVar30,auVar24);
    auVar27 = vpermi2pd_avx512f(_DAT_009ddc00,auVar24,auVar25);
    auVar28 = vpermi2pd_avx512f(_DAT_009ddb80,auVar25,auVar24);
    auVar24 = vpermi2pd_avx512f(_DAT_009ddc80,auVar24,auVar25);
    local_f8 = vpermi2pd_avx512f(_DAT_009ddbc0,auVar28,auVar26);
    local_138 = vpermi2pd_avx512f(_DAT_009ddcc0,auVar24,auVar26);
    _local_178 = vpermi2pd_avx512f(_DAT_009ddc40,auVar27,auVar26);
  }
  lVar11 = 0x10;
  pCVar5 = (trianglemesh->m_vertices).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar17 = *local_180;
  do {
    dVar31 = *(double *)(local_178 + lVar11 + -8);
    uVar9 = uVar17 + 1;
    pCVar1 = pCVar5 + uVar17;
    pCVar1->m_data[0] = *(double *)((long)&local_188 + lVar11);
    pCVar1->m_data[1] = dVar31;
    pdVar2 = (double *)(local_178 + lVar11);
    lVar11 = lVar11 + 0x18;
    pCVar5[uVar17].m_data[2] = *pdVar2;
    uVar17 = uVar9;
  } while (lVar11 != 0xd0);
  lVar11 = 0;
  *local_180 = uVar9;
  uVar14 = 0xd0;
  do {
    local_1a8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)((long)local_b8 + lVar11);
    local_1a8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b8 + lVar11 + 8);
    lVar6 = *(long *)((long)local_b8 + lVar11 + 8);
    if (lVar6 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
      }
    }
    local_1d8._32_8_ =
         (element->super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    p_Stack_1b0 = (element->
                  super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
    p_Var4 = (element->super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    dVar31 = ComputeScalarOutput(this,&local_1a8,(int)uVar14,
                                 (shared_ptr<chrono::fea::ChElementBase> *)(local_1d8 + 0x20));
    ComputeFalseColor((ChVisualShapeFEA *)local_1d8,dVar31);
    pCVar12 = (ChVisualShapeFEA *)
              ((trianglemesh->m_colors).
               super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
               super__Vector_impl_data._M_start + *i_vcols);
    if ((ChVisualShapeFEA *)local_1d8 != pCVar12) {
      (pCVar12->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)local_1d8._0_8_;
      *(undefined4 *)
       &(pCVar12->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_1d8._8_4_;
    }
    uVar14 = extraout_RDX;
    if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
      uVar14 = extraout_RDX_00;
    }
    if (local_1a8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      uVar14 = extraout_RDX_01;
    }
    *i_vcols = *i_vcols + 1;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x80);
  uVar17 = *i_triindex;
  pCVar7 = (trianglemesh->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar8 = SUB84(local_188,0);
  iVar10 = iVar8 + 2;
  iVar13 = iVar8 + 1;
  iVar20 = iVar8 + 3;
  iVar21 = iVar8 + 4;
  iVar19 = iVar8 + 6;
  pCVar7[uVar17].m_data[0] = iVar8;
  pCVar7[uVar17].m_data[1] = iVar10;
  pCVar7[uVar17].m_data[2] = iVar13;
  uVar17 = *i_triindex + 1;
  *i_triindex = uVar17;
  pCVar7[uVar17].m_data[0] = iVar8;
  pCVar7[uVar17].m_data[1] = iVar20;
  pCVar7[uVar17].m_data[2] = iVar10;
  iVar18 = iVar8 + 5;
  uVar17 = *i_triindex + 1;
  *i_triindex = uVar17;
  pCVar7[uVar17].m_data[0] = iVar21;
  pCVar7[uVar17].m_data[1] = iVar18;
  pCVar7[uVar17].m_data[2] = iVar19;
  uVar17 = *i_triindex + 1;
  *i_triindex = uVar17;
  iVar22 = iVar8 + 7;
  pCVar7[uVar17].m_data[0] = iVar21;
  pCVar7[uVar17].m_data[1] = iVar19;
  pCVar7[uVar17].m_data[2] = iVar22;
  uVar17 = *i_triindex + 1;
  *i_triindex = uVar17;
  pCVar7[uVar17].m_data[0] = iVar8;
  pCVar7[uVar17].m_data[1] = iVar22;
  pCVar7[uVar17].m_data[2] = iVar20;
  uVar17 = *i_triindex + 1;
  *i_triindex = uVar17;
  pCVar7[uVar17].m_data[0] = iVar8;
  pCVar7[uVar17].m_data[1] = iVar21;
  pCVar7[uVar17].m_data[2] = iVar22;
  uVar17 = *i_triindex + 1;
  *i_triindex = uVar17;
  pCVar7[uVar17].m_data[0] = iVar8;
  pCVar7[uVar17].m_data[1] = iVar18;
  pCVar7[uVar17].m_data[2] = iVar21;
  uVar17 = *i_triindex + 1;
  *i_triindex = uVar17;
  pCVar7[uVar17].m_data[0] = iVar8;
  pCVar7[uVar17].m_data[1] = iVar13;
  pCVar7[uVar17].m_data[2] = iVar18;
  uVar17 = *i_triindex + 1;
  *i_triindex = uVar17;
  pCVar7[uVar17].m_data[0] = iVar20;
  pCVar7[uVar17].m_data[1] = iVar22;
  pCVar7[uVar17].m_data[2] = iVar19;
  uVar17 = *i_triindex + 1;
  *i_triindex = uVar17;
  pCVar7[uVar17].m_data[0] = iVar20;
  pCVar7[uVar17].m_data[1] = iVar19;
  pCVar7[uVar17].m_data[2] = iVar10;
  uVar17 = *i_triindex + 1;
  *i_triindex = uVar17;
  pCVar7[uVar17].m_data[0] = iVar10;
  pCVar7[uVar17].m_data[1] = iVar18;
  pCVar7[uVar17].m_data[2] = iVar13;
  uVar17 = *i_triindex + 1;
  *i_triindex = uVar17;
  pCVar7[uVar17].m_data[0] = iVar10;
  pCVar7[uVar17].m_data[1] = iVar19;
  pCVar7[uVar17].m_data[2] = iVar18;
  uVar17 = *i_triindex;
  *i_triindex = uVar17 + 1;
  if (this->smooth_faces == true) {
    pCVar7 = (trianglemesh->m_face_n_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar17 = uVar17 - 0xb;
    iVar8 = SUB84(local_198,0);
    pCVar7[uVar17].m_data[0] = iVar8;
    pCVar7[uVar17].m_data[1] = iVar8 + 2;
    pCVar7[uVar17].m_data[2] = iVar8 + 1;
    uVar17 = *i_triindex - 0xb;
    pCVar7[uVar17].m_data[0] = iVar8;
    pCVar7[uVar17].m_data[1] = iVar8 + 3;
    pCVar7[uVar17].m_data[2] = iVar8 + 2;
    uVar17 = *i_triindex - 10;
    pCVar7[uVar17].m_data[0] = iVar8 + 4;
    pCVar7[uVar17].m_data[1] = iVar8 + 5;
    pCVar7[uVar17].m_data[2] = iVar8 + 6;
    uVar17 = *i_triindex - 9;
    pCVar7[uVar17].m_data[0] = iVar8 + 4;
    pCVar7[uVar17].m_data[1] = iVar8 + 6;
    pCVar7[uVar17].m_data[2] = iVar8 + 7;
    uVar17 = *i_triindex - 8;
    pCVar7[uVar17].m_data[0] = iVar8 + 8;
    pCVar7[uVar17].m_data[1] = iVar8 + 9;
    pCVar7[uVar17].m_data[2] = iVar8 + 10;
    uVar17 = *i_triindex - 7;
    pCVar7[uVar17].m_data[0] = iVar8 + 8;
    pCVar7[uVar17].m_data[1] = iVar8 + 0xb;
    pCVar7[uVar17].m_data[2] = iVar8 + 9;
    uVar17 = *i_triindex - 6;
    pCVar7[uVar17].m_data[0] = iVar8 + 0xc;
    pCVar7[uVar17].m_data[1] = iVar8 + 0xd;
    pCVar7[uVar17].m_data[2] = iVar8 + 0xe;
    uVar17 = *i_triindex - 5;
    pCVar7[uVar17].m_data[0] = iVar8 + 0xc;
    pCVar7[uVar17].m_data[1] = iVar8 + 0xf;
    pCVar7[uVar17].m_data[2] = iVar8 + 0xd;
    uVar17 = *i_triindex - 4;
    pCVar7[uVar17].m_data[0] = iVar8 + 0x10;
    pCVar7[uVar17].m_data[1] = iVar8 + 0x12;
    pCVar7[uVar17].m_data[2] = iVar8 + 0x11;
    uVar17 = *i_triindex - 3;
    pCVar7[uVar17].m_data[0] = iVar8 + 0x10;
    pCVar7[uVar17].m_data[1] = iVar8 + 0x11;
    pCVar7[uVar17].m_data[2] = iVar8 + 0x13;
    uVar17 = *i_triindex - 2;
    pCVar7[uVar17].m_data[0] = iVar8 + 0x14;
    pCVar7[uVar17].m_data[1] = iVar8 + 0x15;
    pCVar7[uVar17].m_data[2] = iVar8 + 0x17;
    uVar17 = *i_triindex - 1;
    pCVar7[uVar17].m_data[0] = iVar8 + 0x14;
    pCVar7[uVar17].m_data[1] = iVar8 + 0x16;
    pCVar7[uVar17].m_data[2] = iVar8 + 0x15;
    *local_190 = *local_190 + 0x18;
  }
  lVar11 = 0x80;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_f8 + lVar11 + 0x38) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_f8 + lVar11 + 0x38));
    }
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != 0);
  return;
}

Assistant:

void ChVisualShapeFEA::UpdateBuffers_Hex(std::shared_ptr<ChElementBase> element,
                                         geometry::ChTriangleMeshConnected& trianglemesh,
                                         unsigned int& i_verts,
                                         unsigned int& i_vnorms,
                                         unsigned int& i_vcols,
                                         unsigned int& i_triindex) {
    unsigned int ivert_el = i_verts;
    unsigned int inorm_el = i_vnorms;

    std::shared_ptr<ChNodeFEAxyz> nodes[8];
    ChVector<> pt[8];

    for (int in = 0; in < 8; ++in) {
        nodes[in] = std::static_pointer_cast<ChNodeFEAxyz>(element->GetNodeN(in));
        if (!undeformed_reference)
            pt[in] = nodes[in]->GetPos();
        else
            pt[in] = nodes[in]->GetX0();
    }

    // vertexes

    if (shrink_elements) {
        ChVector<> vc(0, 0, 0);
        for (int in = 0; in < 8; ++in)
            vc += pt[in];
        vc = vc * (1.0 / 8.0);  // average, center of element
        for (int in = 0; in < 8; ++in)
            pt[in] = vc + shrink_factor * (pt[in] - vc);
    }

    for (int in = 0; in < 8; ++in) {
        trianglemesh.getCoordsVertices()[i_verts] = pt[in];
        ++i_verts;
    }

    // colours and colours indexes
    for (int in = 0; in < 8; ++in) {
        trianglemesh.getCoordsColors()[i_vcols] = ComputeFalseColor(ComputeScalarOutput(nodes[in], in, element));
        ++i_vcols;
    }

    // faces indexes
    ChVector<int> ivert_offset(ivert_el, ivert_el, ivert_el);
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 2, 1) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 3, 2) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(4, 5, 6) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(4, 6, 7) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 7, 3) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 4, 7) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 5, 4) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 1, 5) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(3, 7, 6) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(3, 6, 2) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(2, 5, 1) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(2, 6, 5) + ivert_offset;
    ++i_triindex;

    // normals indices (if not defaulting to flat triangles)
    if (smooth_faces) {
        ChVector<int> inorm_offset = ChVector<int>(inorm_el, inorm_el, inorm_el);
        trianglemesh.getIndicesNormals()[i_triindex - 12] = ChVector<int>(0, 2, 1) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 11] = ChVector<int>(0, 3, 2) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 10] = ChVector<int>(4, 5, 6) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 9] = ChVector<int>(4, 6, 7) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 8] = ChVector<int>(8, 9, 10) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 7] = ChVector<int>(8, 11, 9) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 6] = ChVector<int>(12, 13, 14) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 5] = ChVector<int>(12, 15, 13) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 4] = ChVector<int>(16, 18, 17) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 3] = ChVector<int>(16, 17, 19) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 2] = ChVector<int>(20, 21, 23) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 1] = ChVector<int>(20, 22, 21) + inorm_offset;
        i_vnorms += 24;
    }
}